

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misctests.c
# Opt level: O2

void autotest2(void)

{
  int iVar1;
  double *xpred;
  double *amse;
  FILE *__stream;
  double *pdVar2;
  long lVar3;
  auto_arima_object obj;
  int N;
  double dVar4;
  double local_25d8;
  double temp [1200];
  int local_50 [2];
  int order [3];
  int seasonal [3];
  
  local_50[0] = 5;
  local_50[1] = 2;
  order[0] = 5;
  order[1] = 2;
  order[2] = 1;
  xpred = (double *)malloc(0x28);
  amse = (double *)malloc(0x28);
  __stream = fopen("../data/wineind.txt","r");
  if (__stream != (FILE *)0x0) {
    N = -5;
    pdVar2 = &local_25d8;
    while( true ) {
      iVar1 = feof(__stream);
      if (iVar1 != 0) break;
      __isoc99_fscanf(__stream,"%lf\n",pdVar2);
      N = N + 1;
      pdVar2 = pdVar2 + 1;
    }
    pdVar2 = (double *)malloc((long)N * 8);
    for (lVar3 = 0; lVar3 < N; lVar3 = lVar3 + 1) {
      pdVar2[lVar3] = temp[lVar3 + -1];
    }
    obj = auto_arima_init(local_50,order + 1,0xc,0,N);
    auto_arima_setApproximation(obj,0);
    auto_arima_setStepwise(obj,0);
    auto_arima_exec(obj,pdVar2,(double *)0x0);
    auto_arima_summary(obj);
    auto_arima_predict(obj,pdVar2,(double *)0x0,5,(double *)0x0,xpred,amse);
    putchar(10);
    printf("Predicted Values : ");
    for (lVar3 = 0; lVar3 != 5; lVar3 = lVar3 + 1) {
      printf("%g ",xpred[lVar3]);
    }
    putchar(10);
    printf("Standard Errors  : ");
    for (lVar3 = 0; lVar3 != 5; lVar3 = lVar3 + 1) {
      dVar4 = amse[lVar3];
      if (dVar4 < 0.0) {
        dVar4 = sqrt(dVar4);
      }
      else {
        dVar4 = SQRT(dVar4);
      }
      printf("%g ",dVar4);
    }
    putchar(10);
    auto_arima_free(obj);
    free(pdVar2);
    free(xpred);
    free(amse);
    return;
  }
  printf("Cannot Open File");
  exit(100);
}

Assistant:

void autotest2() {
	int i, N, d, D, L;
	double *inp;
	int p, q, P, Q, s, r;
	double *xpred, *amse,*xreg,*newxreg;
	auto_arima_object obj;
    /*
    Make sure all the parameter values are correct and consistent with other values. eg., if xreg is NULL r should be 0
    or if P = D = Q = 0 then make sure that s is also 0. 
     Recheck the values if the program fails to execute.
    */
	p = 5;
	d = 2;
	q = 5;
	s = 12;
	P = 2;
	D = 1;
	Q = 2;
	r = 0;
	int order[3] = {p,d,q};
	int seasonal[3] = {P,D,Q};


	L = 5;

	xpred = (double*)malloc(sizeof(double)* L);
	amse = (double*)malloc(sizeof(double)* L);

	FILE *ifp;
	double temp[1200];
    double temp1[1200];
    double temp2[1200];

	ifp = fopen("../data/wineind.txt", "r");
	i = 0;
	if (!ifp) {
		printf("Cannot Open File");
		exit(100);
	}
	while (!feof(ifp)) {
		fscanf(ifp, "%lf\n", &temp[i]);
		i++;
	}
	N = i - L;

	inp = (double*)malloc(sizeof(double)* N);
    xreg = (double*)malloc(sizeof(double)* N * 2);
    newxreg = (double*)malloc(sizeof(double)* L * 2);


	for (i = 0; i < N; ++i) {
		inp[i] = temp[i];
        //xreg[i] = temp1[i];
		//xreg[N+i] = temp2[i];
	}

    for(i = 0; i < L;++i) {
        //newxreg[i] = temp1[N + i];
        //newxreg[i+L] = temp2[N + i];
    }

	obj = auto_arima_init(order,seasonal,s,r,N);

	auto_arima_setApproximation(obj,0);
	auto_arima_setStepwise(obj,0);

	auto_arima_exec(obj,inp,NULL);

	auto_arima_summary(obj);

	auto_arima_predict(obj, inp, NULL, L,NULL, xpred, amse);

	printf("\n");
	printf("Predicted Values : ");
	for (i = 0; i < L; ++i) {
		printf("%g ", xpred[i]);
	}
	printf("\n");
	printf("Standard Errors  : ");
	for (i = 0; i < L; ++i) {
		printf("%g ", sqrt(amse[i]));
	}
	printf("\n");

	auto_arima_free(obj);

	
	free(inp);
	free(xpred);
	free(amse);
    free(xreg);
    free(newxreg);
}